

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_basic_operations.c
# Opt level: O1

void init_cpu_registers(cpu_registers *registers,uint8_t A,uint8_t X,uint8_t Y,uint16_t PC,uint8_t S
                       ,uint8_t flags)

{
  registers->A = A;
  registers->X = X;
  registers->Y = Y;
  registers->PC = PC;
  registers->S = S;
  registers->flags = flags;
  return;
}

Assistant:

void init_cpu_registers(cpu_registers* registers, uint8_t A, uint8_t X,
                        uint8_t Y, uint16_t PC, uint8_t S, uint8_t flags)
{
    registers->A = A;
    registers->X = X;
    registers->Y = Y;
    registers->PC = PC;
    registers->S = S;
    registers->flags = flags;
}